

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O2

void __thiscall
QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
          (iterator *this,QStringTokenizerBase<QStringView,_QChar> *t)

{
  this->tokenizer = t;
  toFront(&this->current,t);
  return;
}

Assistant:

explicit iterator(const QStringTokenizerBase &t) noexcept
            : tokenizer{&t}, current{t.toFront()} {}